

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O0

void __thiscall highs::parallel::TaskGroup::sync(TaskGroup *this)

{
  parallel::sync();
  return;
}

Assistant:

void sync() const {
    assert(workerDeque->getCurrentHead() > dequeHead);
    highs::parallel::sync(workerDeque);
  }